

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O0

void h2o_filecache_close_file(h2o_filecache_ref_t *ref)

{
  int iVar1;
  size_t sVar2;
  h2o_filecache_ref_t *ref_local;
  
  sVar2 = ref->_refcnt - 1;
  ref->_refcnt = sVar2;
  if (sVar2 == 0) {
    iVar1 = h2o_linklist_is_linked(&ref->_lru);
    if (iVar1 != 0) {
      __assert_fail("!h2o_linklist_is_linked(&ref->_lru)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                    ,0x8f,"void h2o_filecache_close_file(h2o_filecache_ref_t *)");
    }
    if (ref->fd != -1) {
      close(ref->fd);
      ref->fd = -1;
    }
    free(ref);
  }
  return;
}

Assistant:

void h2o_filecache_close_file(h2o_filecache_ref_t *ref)
{
    if (--ref->_refcnt != 0)
        return;
    assert(!h2o_linklist_is_linked(&ref->_lru));
    if (ref->fd != -1) {
        close(ref->fd);
        ref->fd = -1;
    }
    free(ref);
}